

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getnameinfo.c
# Opt level: O0

int uv_getnameinfo(uv_loop_t *loop,uv_getnameinfo_t *req,uv_getnameinfo_cb getnameinfo_cb,
                  sockaddr *addr,int flags)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int flags_local;
  sockaddr *addr_local;
  uv_getnameinfo_cb getnameinfo_cb_local;
  uv_getnameinfo_t *req_local;
  uv_loop_t *loop_local;
  
  if ((req == (uv_getnameinfo_t *)0x0) || (addr == (sockaddr *)0x0)) {
    loop_local._4_4_ = -0x16;
  }
  else {
    if (addr->sa_family == 2) {
      cVar1 = addr->sa_data[0];
      cVar2 = addr->sa_data[1];
      cVar3 = addr->sa_data[2];
      cVar4 = addr->sa_data[3];
      cVar5 = addr->sa_data[4];
      cVar6 = addr->sa_data[5];
      (req->storage).ss_family = addr->sa_family;
      (req->storage).__ss_padding[0] = cVar1;
      (req->storage).__ss_padding[1] = cVar2;
      (req->storage).__ss_padding[2] = cVar3;
      (req->storage).__ss_padding[3] = cVar4;
      (req->storage).__ss_padding[4] = cVar5;
      (req->storage).__ss_padding[5] = cVar6;
      *(undefined8 *)((req->storage).__ss_padding + 6) = *(undefined8 *)(addr->sa_data + 6);
    }
    else {
      if (addr->sa_family != 10) {
        return -0x16;
      }
      cVar1 = addr->sa_data[0];
      cVar2 = addr->sa_data[1];
      cVar3 = addr->sa_data[2];
      cVar4 = addr->sa_data[3];
      cVar5 = addr->sa_data[4];
      cVar6 = addr->sa_data[5];
      (req->storage).ss_family = addr->sa_family;
      (req->storage).__ss_padding[0] = cVar1;
      (req->storage).__ss_padding[1] = cVar2;
      (req->storage).__ss_padding[2] = cVar3;
      (req->storage).__ss_padding[3] = cVar4;
      (req->storage).__ss_padding[4] = cVar5;
      (req->storage).__ss_padding[5] = cVar6;
      *(undefined8 *)((req->storage).__ss_padding + 6) = *(undefined8 *)(addr->sa_data + 6);
      *(undefined8 *)((req->storage).__ss_padding + 0xe) = *(undefined8 *)(addr + 1);
      *(undefined4 *)((req->storage).__ss_padding + 0x16) = *(undefined4 *)(addr[1].sa_data + 6);
    }
    req->loop = loop;
    req->type = UV_GETNAMEINFO;
    (loop->active_reqs).count = (loop->active_reqs).count + 1;
    req->getnameinfo_cb = getnameinfo_cb;
    req->flags = flags;
    req->type = UV_GETNAMEINFO;
    req->retcode = 0;
    if (getnameinfo_cb == (uv_getnameinfo_cb)0x0) {
      uv__getnameinfo_work(&req->work_req);
      uv__getnameinfo_done(&req->work_req,0);
      loop_local._4_4_ = req->retcode;
    }
    else {
      uv__work_submit(loop,&req->work_req,UV__WORK_SLOW_IO,uv__getnameinfo_work,uv__getnameinfo_done
                     );
      loop_local._4_4_ = 0;
    }
  }
  return loop_local._4_4_;
}

Assistant:

int uv_getnameinfo(uv_loop_t* loop,
                   uv_getnameinfo_t* req,
                   uv_getnameinfo_cb getnameinfo_cb,
                   const struct sockaddr* addr,
                   int flags) {
  if (req == NULL || addr == NULL)
    return UV_EINVAL;

  if (addr->sa_family == AF_INET) {
    memcpy(&req->storage,
           addr,
           sizeof(struct sockaddr_in));
  } else if (addr->sa_family == AF_INET6) {
    memcpy(&req->storage,
           addr,
           sizeof(struct sockaddr_in6));
  } else {
    return UV_EINVAL;
  }

  uv__req_init(loop, (uv_req_t*)req, UV_GETNAMEINFO);

  req->getnameinfo_cb = getnameinfo_cb;
  req->flags = flags;
  req->type = UV_GETNAMEINFO;
  req->retcode = 0;

  if (getnameinfo_cb) {
    uv__work_submit(loop,
                    &req->work_req,
                    UV__WORK_SLOW_IO,
                    uv__getnameinfo_work,
                    uv__getnameinfo_done);
    return 0;
  } else {
    uv__getnameinfo_work(&req->work_req);
    uv__getnameinfo_done(&req->work_req, 0);
    return req->retcode;
  }
}